

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

OutputFile * __thiscall re2c::OutputFile::wuser_start_label(OutputFile *this)

{
  string label;
  string local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,
             (string *)
             &(this->blocks).
              super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>._M_impl.
              super__Vector_impl_data._M_finish[-1]->user_start_label);
  if (local_30._M_string_length != 0) {
    wstring(this,&local_30);
    ws(this,":\n");
  }
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

OutputFile & OutputFile::wuser_start_label ()
{
	const std::string label = blocks.back ()->user_start_label;
	if (!label.empty ())
	{
		wstring(label).ws(":\n");
	}
	return *this;
}